

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall gimage::Histogram::visualize(Histogram *this,ImageU8 *image)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  size_t __n;
  long lVar8;
  ulong uVar9;
  int i;
  ulong uVar10;
  
  uVar9 = 0;
  uVar3 = (ulong)*(uint *)this;
  if ((int)*(uint *)this < 1) {
    uVar3 = uVar9;
  }
  uVar5 = (ulong)*(uint *)(this + 4);
  if ((int)*(uint *)(this + 4) < 1) {
    uVar5 = uVar9;
  }
  uVar7 = 1;
  for (; uVar9 != uVar5; uVar9 = uVar9 + 1) {
    for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
      uVar1 = *(ulong *)(*(long *)(*(long *)(this + 0x18) + uVar9 * 8) + uVar10 * 8);
      if (uVar7 <= uVar1) {
        uVar7 = uVar1;
      }
    }
  }
  if ((long)*(int *)(this + 4) < 2) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (image,(long)*(int *)this,0x100,1);
    sVar2 = image->n;
    __n = -sVar2;
    if (0 < (long)sVar2) {
      __n = sVar2;
    }
    memset(image->pixel,0,__n);
    for (lVar6 = 0; lVar6 < *(int *)this; lVar6 = lVar6 + 1) {
      for (uVar4 = 0xff - (int)((ulong)(*(long *)(*(long *)(this + 0x10) + lVar6 * 8) * 0xff) /
                               uVar7); -1 < (int)uVar4; uVar4 = uVar4 - 1) {
        (*image->img)[uVar4][lVar6] = 0xff;
      }
    }
  }
  else {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (image,(long)*(int *)this,(long)*(int *)(this + 4),1);
    for (lVar6 = 0; lVar6 < *(int *)(this + 4); lVar6 = lVar6 + 1) {
      for (lVar8 = 0; lVar8 < *(int *)this; lVar8 = lVar8 + 1) {
        (*image->img)[lVar6][lVar8] =
             ~(byte)((ulong)(*(long *)(*(long *)(*(long *)(this + 0x18) + lVar6 * 8) + lVar8 * 8) *
                            0xff) / uVar7);
      }
    }
  }
  return;
}

Assistant:

void Histogram::visualize(ImageU8 &image) const
{
  unsigned long maxval=1;

  for (int k=0; k<h; k++)
  {
    for (int i=0; i<w; i++)
    {
      maxval=std::max(maxval, row[k][i]);
    }
  }

  visualize(image, maxval);
}